

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void palette_rebuild(Terminal *term)

{
  rgb *prVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint8_t in_R9B;
  uint8_t in_R10B;
  uint8_t in_R11B;
  ulong uVar7;
  ulong uVar8;
  
  if (term->win_palette_pending == true) {
    uVar4 = term->win_palette_pending_min;
    uVar3 = term->win_palette_pending_limit - 1;
  }
  else {
    uVar3 = 0;
    uVar4 = 0x106;
  }
  lVar6 = 0;
  do {
    uVar2 = 2;
    do {
      uVar8 = uVar2;
      if (uVar8 == 0xffffffffffffffff) goto LAB_001113a9;
      uVar7 = uVar8 & 0xffffffff;
      uVar2 = uVar8 - 1;
    } while (term->subpalettes[uVar7].present[lVar6] != true);
    in_R9B = term->subpalettes[uVar7].values[lVar6].r;
    in_R10B = term->subpalettes[uVar7].values[lVar6].g;
    in_R11B = term->subpalettes[uVar7].values[lVar6].b;
LAB_001113a9:
    if (uVar8 == 0xffffffffffffffff) {
      __assert_fail("found",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x736,"void palette_rebuild(Terminal *)");
    }
    prVar1 = term->palette + lVar6;
    if (((in_R9B != term->palette[lVar6].r) || (in_R10B != prVar1->g)) || (in_R11B != prVar1->b)) {
      prVar1->r = in_R9B;
      prVar1->g = in_R10B;
      prVar1->b = in_R11B;
      uVar5 = (uint)lVar6;
      if (uVar5 <= uVar4) {
        uVar4 = uVar5;
      }
      if (uVar3 <= uVar5) {
        uVar3 = uVar5;
      }
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x106) {
      if (uVar3 < uVar4) {
        return;
      }
      term->win_palette_pending = true;
      term->win_palette_pending_min = uVar4;
      term->win_palette_pending_limit = uVar3 + 1;
      term_invalidate(term);
      return;
    }
  } while( true );
}

Assistant:

static void palette_rebuild(Terminal *term)
{
    unsigned min_changed = OSC4_NCOLOURS, max_changed = 0;

    if (term->win_palette_pending) {
        /* Possibly extend existing range. */
        min_changed = term->win_palette_pending_min;
        max_changed = term->win_palette_pending_limit - 1;
    } else {
        /* Start with empty range. */
        min_changed = OSC4_NCOLOURS;
        max_changed = 0;
    }

    for (unsigned i = 0; i < OSC4_NCOLOURS; i++) {
        rgb new_value;
        bool found = false;

        for (unsigned j = lenof(term->subpalettes); j-- > 0 ;) {
            if (term->subpalettes[j].present[i]) {
                new_value = term->subpalettes[j].values[i];
                found = true;
                break;
            }
        }

        assert(found);    /* we expect SUBPAL_CONF to always be set */

        if (new_value.r != term->palette[i].r ||
            new_value.g != term->palette[i].g ||
            new_value.b != term->palette[i].b) {
            term->palette[i] = new_value;
            if (min_changed > i)
                min_changed = i;
            if (max_changed < i)
                max_changed = i;
        }
    }

    if (min_changed <= max_changed) {
        /*
         * At least one colour changed (or we had an update scheduled
         * already). Schedule a redraw event to pass the result back
         * to the TermWin. This also requires invalidating the rest
         * of the window, because usually all the text will need
         * redrawing in the new colours.
         * (If there was an update pending and this palette rebuild
         * didn't actually change anything, we'll harmlessly reinforce
         * the existing update request.)
         */
        term->win_palette_pending = true;
        term->win_palette_pending_min = min_changed;
        term->win_palette_pending_limit = max_changed + 1;
        term_invalidate(term);
    }
}